

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_function_primitive_adoptDefinitionOf
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong *puVar5;
  ulong *puVar6;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  puVar5 = (ulong *)*arguments;
  if (((((ulong)puVar5 & 0xf) != 0 || puVar5 == (ulong *)0x0) ||
      (uVar3 = *puVar5, (uVar3 & 0xf) != 0 || uVar3 == 0)) || ((*(byte *)(uVar3 + 8) & 0x80) != 0))
  {
LAB_0011d042:
    sysbvm_error("Expected a function.");
  }
  uVar3 = *(ulong *)(uVar3 + 0x70);
  if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
    uVar2 = (uint)((long)uVar3 >> 4);
  }
  else {
    uVar2 = (uint)*(undefined8 *)(uVar3 + 0x10);
  }
  if ((uVar2 >> 0xc & 1) == 0) goto LAB_0011d042;
  puVar5 = (ulong *)arguments[1];
  if (((((ulong)puVar5 & 0xf) != 0 || puVar5 == (ulong *)0x0) ||
      (uVar3 = *puVar5, (uVar3 & 0xf) != 0 || uVar3 == 0)) || ((*(byte *)(uVar3 + 8) & 0x80) != 0))
  {
LAB_0011d09e:
    sysbvm_error("Expected a function.");
  }
  uVar3 = *(ulong *)(uVar3 + 0x70);
  if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
    uVar2 = (uint)((long)uVar3 >> 4);
  }
  else {
    uVar2 = (uint)*(undefined8 *)(uVar3 + 0x10);
  }
  if ((uVar2 >> 0xc & 1) == 0) goto LAB_0011d09e;
  sVar1 = *arguments;
  *(ulong *)(sVar1 + 0x48) = puVar5[9];
  uVar3 = puVar5[8];
  *(ulong *)(sVar1 + 0x38) = puVar5[7];
  *(ulong *)(sVar1 + 0x40) = uVar3;
  puVar6 = (ulong *)*arguments;
  if (((((ulong)puVar6 & 0xf) == 0 && puVar6 != (ulong *)0x0) &&
      (uVar3 = *puVar6, (uVar3 & 0xf) == 0 && uVar3 != 0)) && ((*(byte *)(uVar3 + 8) & 0x80) == 0))
  {
    uVar3 = *(ulong *)(uVar3 + 0x70);
    if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
      uVar2 = (uint)((long)uVar3 >> 4);
    }
    else {
      uVar2 = (uint)*(undefined8 *)(uVar3 + 0x10);
    }
    if ((uVar2 >> 0xc & 1) == 0) goto LAB_0011d118;
    uVar3 = puVar6[5];
    if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
      if ((uVar3 & 0x40) == 0) goto LAB_0011d118;
      uVar2 = (uint)((long)uVar3 >> 4);
    }
    else {
      if ((*(byte *)(uVar3 + 0x10) & 4) == 0) goto LAB_0011d118;
      uVar2 = (uint)*(undefined8 *)(uVar3 + 0x10);
    }
    uVar3 = puVar5[5];
    if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
      uVar3 = (long)uVar3 >> 4;
    }
    else {
      uVar3 = *(ulong *)(uVar3 + 0x10);
    }
    puVar6[5] = (uVar3 | uVar2 & 0x8001c) << 4 | 0xb;
    uVar3 = puVar5[0xb];
    lVar4 = 0x58;
    if (uVar3 == 0) goto LAB_0011d135;
  }
  else {
LAB_0011d118:
    puVar6[5] = puVar5[5];
    uVar3 = puVar5[0xb];
    puVar6[10] = puVar5[10];
    puVar6[0xb] = uVar3;
    uVar3 = puVar5[0xd];
    lVar4 = 0x68;
  }
  *(ulong *)((long)puVar6 + lVar4) = uVar3;
LAB_0011d135:
  puVar6 = (ulong *)*arguments;
  if (puVar6[3] != 0 || puVar6[2] != 0) {
    sysbvm_programEntity_recordBindingWithOwnerAndName(context,puVar6[9],puVar6[3],puVar6[2]);
    puVar6 = (ulong *)*arguments;
    puVar5 = (ulong *)arguments[1];
  }
  uVar3 = (ulong)puVar5 & 0xf;
  if (uVar3 == 0 && puVar5 != (ulong *)0x0) {
    uVar3 = *puVar5;
  }
  else if ((int)uVar3 == 0xf) {
    uVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)puVar5 >> 4);
  }
  else {
    uVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar3);
  }
  *puVar6 = uVar3;
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_adoptDefinitionOf(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *definitionFunction = &arguments[1];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    if(!sysbvm_tuple_isFunction(context, *definitionFunction)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    sysbvm_function_t **definitionFunctionObject = (sysbvm_function_t**)definitionFunction;

    (*functionObject)->definition = (*definitionFunctionObject)->definition;
    (*functionObject)->captureVector = (*definitionFunctionObject)->captureVector;
    (*functionObject)->captureEnvironment = (*definitionFunctionObject)->captureEnvironment;
    bool isCorePrimitive = sysbvm_function_isCorePrimitive(context, *function);
    if(isCorePrimitive)
    {
        (*functionObject)->flags = sysbvm_tuple_bitflags_encode(
            (sysbvm_tuple_bitflags_decode((*functionObject)->flags) & SYSBVM_FUNCTION_FLAGS_BOOTSTRAP_PRIMITIVE_KEPT_FLAGS)
            | sysbvm_tuple_bitflags_decode((*definitionFunctionObject)->flags)
        );

        if((*definitionFunctionObject)->primitiveName)
            (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
    }
    else
    {
        (*functionObject)->flags = (*definitionFunctionObject)->flags;
        (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
        (*functionObject)->primitiveTableIndex = (*definitionFunctionObject)->primitiveTableIndex;
        (*functionObject)->annotations = (*definitionFunctionObject)->annotations;
    }

    if((*functionObject)->super.owner || (*functionObject)->super.name)
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, (*functionObject)->definition, (*functionObject)->super.owner, (*functionObject)->super.name);
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)*functionObject, sysbvm_tuple_getType(context, (sysbvm_tuple_t)*definitionFunctionObject));
    return SYSBVM_VOID_TUPLE;
}